

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  string *psVar2;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  size_type sVar3;
  undefined8 uVar4;
  pointer pcVar5;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  bool local_45;
  anon_enum_32 local_44;
  anon_enum_32 local_40 [4];
  
  local_45 = packed;
  pVar6 = Insert(this,number);
  pEVar1 = pVar6.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_40[0] = pEVar1->is_repeated ^ OPTIONAL_FIELD;
    local_44 = REPEATED_FIELD;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                       (local_40,&local_44,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
    if (psVar2 == (string *)0x0) {
      local_40[0] = anon_unknown_58::cpp_type(pEVar1->type);
      local_44 = 8;
      psVar2 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (local_40,&local_44,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
      if (psVar2 == (string *)0x0) {
        psVar2 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                           (&pEVar1->is_packed,&local_45,"extension->is_packed == packed");
        if (psVar2 != (string *)0x0) {
          pcVar5 = (psVar2->_M_dataplus)._M_p;
          sVar3 = psVar2->_M_string_length;
          uVar4 = 0x231;
          goto LAB_0022f17c;
        }
        this_00 = pEVar1->field_0;
        goto LAB_0022f111;
      }
    }
    pcVar5 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    uVar4 = 0x230;
  }
  else {
    pEVar1->type = type;
    local_40[0] = anon_unknown_58::cpp_type(type);
    local_44 = 8;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_40,&local_44,
                        "cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM");
    if (psVar2 == (string *)0x0) {
      pEVar1->is_repeated = true;
      pEVar1->field_0xa = pEVar1->field_0xa | 1;
      pEVar1->is_packed = packed;
      this_00 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                Arena::CreateArenaCompatible<google::protobuf::RepeatedField<int>>(this->arena_);
      pEVar1->field_0 = this_00;
LAB_0022f111:
      RepeatedField<int>::Add((RepeatedField<int> *)this_00,value);
      return;
    }
    pcVar5 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    uVar4 = 0x229;
  }
LAB_0022f17c:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,uVar4,sVar3,pcVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_40);
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = packed;
    extension->ptr.repeated_enum_value =
        Arena::Create<RepeatedField<int>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    ABSL_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->ptr.repeated_enum_value->Add(value);
}